

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::
     generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Node *pNVar1;
  StorageQualifier *this;
  TransformFeedbackTarget *pTVar2;
  ResourceTestCase *pRVar3;
  Variable *pVVar4;
  ArrayElement *pAVar5;
  ProgramResourceQueryTestTarget local_140;
  undefined1 local_138 [8];
  SharedPtr variable_3;
  SharedPtr xfbTarget_4;
  SharedPtr arrayElem_1;
  undefined1 local_100 [8];
  SharedPtr variable_2;
  SharedPtr arrayElem;
  SharedPtr xfbTarget_3;
  undefined1 local_c8 [8];
  SharedPtr variable_1;
  SharedPtr xfbTarget_2;
  SharedPtr structMbr;
  undefined1 local_90 [8];
  SharedPtr variable;
  SharedPtr xfbTarget_1;
  undefined1 local_68 [8];
  SharedPtr xfbTarget;
  SharedPtr output;
  undefined1 local_38 [8];
  SharedPtr defaultBlock;
  bool reducedSet_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  defaultBlock.m_state._7_1_ = reducedSet;
  pNVar1 = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)pNVar1,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_38,pNVar1);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,(SharedPtr *)local_38,STORAGE_OUT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget.m_state,(Node *)this);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)local_38,"gl_Position");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_68,(Node *)pTVar2);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&xfbTarget_1.m_state,
             PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,2);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_68,
             (ProgramResourceQueryTestTarget *)&xfbTarget_1.m_state,"builtin_gl_position");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_68);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable.m_state,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_90,(Node *)pVVar4);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&structMbr.m_state,
             PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,2);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_90,
             (ProgramResourceQueryTestTarget *)&structMbr.m_state,"default_block_basic_type");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_90);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable.m_state);
  pNVar1 = (Node *)operator_new(0x20);
  ResourceDefinition::StructMember::StructMember
            ((StructMember *)pNVar1,(SharedPtr *)&xfbTarget.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget_2.m_state,pNVar1);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget_2.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable_1.m_state,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_1.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_c8,(Node *)pVVar4);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&xfbTarget_3.m_state,
             PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,2);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_c8,
             (ProgramResourceQueryTestTarget *)&xfbTarget_3.m_state,"default_block_struct_member");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_c8);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable_1.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget_2.m_state);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&arrayElem.m_state,(Node *)pTVar2);
  pAVar5 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar5,(SharedPtr *)&arrayElem.m_state,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable_2.m_state,(Node *)pAVar5);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_2.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_100,(Node *)pVVar4);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&arrayElem_1.m_state,
             PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,2);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_100,
             (ProgramResourceQueryTestTarget *)&arrayElem_1.m_state,"default_block_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_100);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable_2.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&arrayElem.m_state);
  pAVar5 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar5,(SharedPtr *)&xfbTarget.m_state,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&xfbTarget_4.m_state,(Node *)pAVar5);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,(SharedPtr *)&xfbTarget_4.m_state,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable_3.m_state,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,(SharedPtr *)&variable_3.m_state,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_138,(Node *)pVVar4);
  pRVar3 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_140,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,2);
  ResourceTestCase::ResourceTestCase
            (pRVar3,context,(SharedPtr *)local_138,&local_140,"default_block_array_element");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_138);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable_3.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget_4.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&xfbTarget.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateTransformFeedbackVariableBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	output			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_OUT));

	DE_UNREF(reducedSet);

	// .builtin_gl_position
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget(new ResourceDefinition::TransformFeedbackTarget(defaultBlock, "gl_Position"));
		targetGroup->addChild(new ResourceTestCase(context, xfbTarget, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "builtin_gl_position"));
	}
	// .default_block_basic_type
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_basic_type"));
	}
	// .default_block_struct_member
	{
		const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(structMbr));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_struct_member"));
	}
	// .default_block_array
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(xfbTarget));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_array"));
	}
	// .default_block_array_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(arrayElem));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_array_element"));
	}
}